

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

bool __thiscall
duckdb::StrpTimeFormat::TryParseDate(StrpTimeFormat *this,char *data,size_t size,date_t *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ParseResult parse_result;
  ParseResult local_88;
  
  paVar1 = &local_88.tz.field_2;
  local_88.tz._M_string_length = 0;
  local_88.tz.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_88.error_message.field_2;
  local_88.error_message._M_string_length = 0;
  local_88.error_message.field_2._M_local_buf[0] = '\0';
  local_88.error_position.index = 0xffffffffffffffff;
  local_88.tz._M_dataplus._M_p = (pointer)paVar1;
  local_88.error_message._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = Parse(this,data,size,&local_88,false);
  if (bVar3) {
    bVar3 = Date::TryFromDate(local_88.data[0],local_88.data[1],local_88.data[2],result);
  }
  else {
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.error_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_88.error_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tz._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.tz._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool StrpTimeFormat::TryParseDate(const char *data, size_t size, date_t &result) const {
	ParseResult parse_result;
	if (!Parse(data, size, parse_result)) {
		return false;
	}
	return parse_result.TryToDate(result);
}